

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall JetHead::Socket::Socket(Socket *this,bool sock_stream)

{
  int iVar1;
  undefined8 in_R9;
  Address *this_00;
  undefined4 local_28 [2];
  int on;
  byte local_11;
  Socket *pSStack_10;
  bool sock_stream_local;
  Socket *this_local;
  
  local_11 = sock_stream;
  pSStack_10 = this;
  SelectorListener::SelectorListener(&this->super_SelectorListener);
  IReaderWriter::IReaderWriter(&this->super_IReaderWriter);
  (this->super_SelectorListener)._vptr_SelectorListener =
       (_func_int **)&PTR_processFileEvents_00147940;
  (this->super_IReaderWriter)._vptr_IReaderWriter = (_func_int **)&PTR__Socket_00147988;
  this->mConnectedAsync = false;
  this->mListener = (SocketListener *)0x0;
  this->mFd = -1;
  this->mSelector = (Selector *)0x0;
  this->mConnected = false;
  this->mPrivateData = 0;
  this->mSockStream = (bool)(local_11 & 1);
  this->mParent = this;
  this->mReadTimeout = 0;
  this_00 = &this->mLastDatagramSender;
  Address::Address(this_00);
  if ((local_11 & 1) == 0) {
    iVar1 = socket(2,2,0);
    this->mFd = iVar1;
  }
  else {
    iVar1 = socket(2,1,0);
    this->mFd = iVar1;
  }
  if (this->mFd == -1) {
    jh_log_print(1,"JetHead::Socket::Socket(bool)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x46,"Failed to create socket",in_R9,this,this_00);
  }
  else {
    local_28[0] = 1;
    setsockopt(this->mFd,1,2,local_28,4);
  }
  return;
}

Assistant:

Socket::Socket( bool sock_stream )
	:	mConnectedAsync( false ),
		mListener( NULL ),
		mFd( -1 ),
		mSelector( NULL ),
		mConnected( false ), mPrivateData( 0 ), mSockStream( sock_stream ),
		mParent(this), mReadTimeout( 0 )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	if ( sock_stream )
		mFd = socket( AF_INET, SOCK_STREAM, 0 );
	else
		mFd = socket( AF_INET, SOCK_DGRAM, 0 );

	if ( mFd == -1 )
	{
		LOG_ERR_FATAL( "Failed to create socket" );
		return;
	}
	
	int on = 1;
	setsockopt( mFd, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on) );
	LOG_NOISE( "fd %d", mFd );
}